

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e
ktxTexture2_GetImageOffset
          (ktxTexture2 *This,ktx_uint32_t level,ktx_uint32_t layer,ktx_uint32_t faceSlice,
          ktx_size_t *pOffset)

{
  ktx_uint64_t kVar1;
  ktx_size_t kVar2;
  uint in_ECX;
  ktxFormatVersionEnum in_EDX;
  uint in_ESI;
  ktxTexture2 *in_RDI;
  ktx_uint64_t *in_R8;
  ktx_size_t imageSize;
  ktx_size_t layerSize;
  ktx_uint32_t maxSlice;
  uint in_stack_ffffffffffffffbc;
  ktxTexture2 *in_stack_ffffffffffffffc0;
  ktx_error_code_e local_4;
  
  if (in_RDI == (ktxTexture2 *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if ((in_ESI < in_RDI->numLevels) && (in_EDX < in_RDI->numLayers)) {
    if (in_RDI->supercompressionScheme == KTX_SS_BEGIN_RANGE) {
      if ((in_RDI->isCubemap & 1U) == 0) {
        if (in_RDI->baseDepth >> ((byte)in_ESI & 0x1f) == 0) {
          in_stack_ffffffffffffffbc = 1;
        }
        else {
          in_stack_ffffffffffffffbc = in_RDI->baseDepth >> ((byte)in_ESI & 0x1f);
        }
        if (in_stack_ffffffffffffffbc <= in_ECX) {
          return KTX_INVALID_OPERATION;
        }
      }
      else if (in_RDI->numFaces <= in_ECX) {
        return KTX_INVALID_OPERATION;
      }
      kVar1 = ktxTexture2_levelDataOffset(in_RDI,in_ESI);
      *in_R8 = kVar1;
      if (in_EDX != 0) {
        kVar2 = ktxTexture_layerSize((ktxTexture *)in_RDI,in_ESI,in_EDX);
        *in_R8 = in_EDX * kVar2 + *in_R8;
      }
      if (in_ECX != 0) {
        kVar2 = ktxTexture2_GetImageSize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        *in_R8 = in_ECX * kVar2 + *in_R8;
      }
      local_4 = KTX_SUCCESS;
    }
    else {
      local_4 = KTX_INVALID_OPERATION;
    }
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_GetImageOffset(ktxTexture2* This, ktx_uint32_t level,
                          ktx_uint32_t layer, ktx_uint32_t faceSlice,
                          ktx_size_t* pOffset)
{
    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (level >= This->numLevels || layer >= This->numLayers)
        return KTX_INVALID_OPERATION;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    if (This->isCubemap) {
        if (faceSlice >= This->numFaces)
            return KTX_INVALID_OPERATION;
    } else {
        ktx_uint32_t maxSlice = MAX(1, This->baseDepth >> level);
        if (faceSlice >= maxSlice)
            return KTX_INVALID_OPERATION;
    }

    // Get the offset of the start of the level.
    *pOffset = ktxTexture2_levelDataOffset(This, level);

    // All layers, faces & slices within a level are the same size.
    if (layer != 0) {
        ktx_size_t layerSize;
        layerSize = ktxTexture_layerSize(ktxTexture(This), level,
                                         KTX_FORMAT_VERSION_TWO);
        *pOffset += layer * layerSize;
    }
    if (faceSlice != 0) {
        ktx_size_t imageSize;
        imageSize = ktxTexture2_GetImageSize(This, level);
        *pOffset += faceSlice * imageSize;
    }
    return KTX_SUCCESS;
}